

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_24::Inhabitator::markNullable(Inhabitator *this,FieldPos field)

{
  undefined8 *puVar1;
  uint uVar2;
  uintptr_t *puVar3;
  HeapType type;
  bool bVar4;
  __hashtable *p_Var5;
  uint uVar6;
  undefined8 uVar7;
  __hashtable *p_Var8;
  int iVar9;
  long *plVar10;
  __hashtable *p_Var11;
  byte extraout_DL;
  byte bVar12;
  byte extraout_DL_00;
  FieldPos *pFVar13;
  __hashtable *__h;
  ulong uVar14;
  uintptr_t *puVar15;
  undefined1 auVar16 [16];
  __hashtable *p_Stack_148;
  FieldPos field_local;
  __node_gen_type __node_gen;
  long lStack_88;
  __hashtable *local_68;
  __hashtable *local_60;
  __hashtable *__h_1;
  __node_gen_type __node_gen_1;
  HeapType local_48;
  
  p_Stack_148 = (__hashtable *)field.first.id;
  field_local.first.id._0_4_ = field.second;
  field_local._8_8_ = &this->nullables;
  local_60 = (__hashtable *)field_local._8_8_;
  std::
  _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<std::pair<wasm::HeapType,unsigned_int>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType,unsigned_int>,true>>>>
            ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)field_local._8_8_,&p_Stack_148);
  uVar6 = (uint)field_local.first.id;
  local_48.id = (uintptr_t)p_Stack_148;
  __h_1 = p_Stack_148;
  __node_gen_1._M_h._0_4_ = (uint)field_local.first.id;
  if ((p_Stack_148 < (__hashtable *)0x7d) || (iVar9 = ::wasm::HeapType::getKind(), iVar9 == 1)) {
    __assert_fail("!type.isBasic() && !type.isSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x2c5,
                  "Inhabitator::Variance wasm::(anonymous namespace)::Inhabitator::getVariance(FieldPos)"
                 );
  }
  uVar14 = (ulong)(uint)__node_gen_1._M_h;
  local_68 = __h_1;
  iVar9 = ::wasm::HeapType::getKind();
  if (iVar9 == 3) {
    ::wasm::HeapType::getArray();
  }
  else {
    if (iVar9 != 2) {
      bVar4 = false;
      goto LAB_0019c6c7;
    }
    plVar10 = (long *)::wasm::HeapType::getStruct();
    puVar1 = (undefined8 *)(*plVar10 + uVar14 * 0x10);
    field_local._8_8_ = *puVar1;
    __node_gen._M_h._4_4_ = (int)((ulong)puVar1[1] >> 0x20);
  }
  bVar4 = true;
LAB_0019c6c7:
  p_Var11 = local_60;
  if (!bVar4) {
    __assert_fail("field",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x2c7,
                  "Inhabitator::Variance wasm::(anonymous namespace)::Inhabitator::getVariance(FieldPos)"
                 );
  }
  if (__node_gen._M_h._4_4_ == 1) {
    iVar9 = ::wasm::HeapType::getKind();
    if (iVar9 == 3) {
      auVar16 = ::wasm::HeapType::getDeclaredSuperType();
      p_Var8 = auVar16._0_8_;
      while (p_Var5 = p_Var8, (auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar16 = ::wasm::HeapType::getDeclaredSuperType();
        p_Var8 = auVar16._0_8_;
        local_48.id = (uintptr_t)p_Var5;
      }
    }
    else {
      iVar9 = ::wasm::HeapType::getKind();
      if (iVar9 != 2) {
        __assert_fail("curr.isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                      ,0x2e6,"void wasm::(anonymous namespace)::Inhabitator::markNullable(FieldPos)"
                     );
      }
      field_local._8_8_ = ::wasm::HeapType::getDeclaredSuperType();
      bVar12 = extraout_DL;
      while (((bVar12 & 1) != 0 &&
             (plVar10 = (long *)::wasm::HeapType::getStruct(), uVar7 = field_local._8_8_,
             (ulong)uVar6 < (ulong)(plVar10[1] - *plVar10 >> 4)))) {
        field_local._8_8_ = ::wasm::HeapType::getDeclaredSuperType();
        local_48.id = uVar7;
        bVar12 = extraout_DL_00;
      }
    }
    field_local._8_8_ = local_48.id;
    __h_1 = p_Var11;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::pair<wasm::HeapType,unsigned_int>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType,unsigned_int>,true>>>>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)p_Var11,&field_local.second);
    field_local.second = 0;
    field_local._12_4_ = 0;
    lStack_88 = 0;
    __h_1 = (__hashtable *)SubTypes::getImmediateSubTypes(&this->subtypes,local_48);
    __node_gen_1._M_h._0_4_ = 1;
    SmallVector<Item,_10UL>::push_back
              ((SmallVector<Item,_10UL> *)&field_local.second,(Item *)&__h_1);
    if (field_local._8_8_ != 0) {
      do {
        if (lStack_88 == 0) {
          if (field_local._8_8_ == 0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x7e,"T &wasm::SmallVector<Item, 10>::back() [T = Item, N = 10]");
          }
          pFVar13 = &field_local + field_local._8_8_;
        }
        else {
          pFVar13 = (FieldPos *)(lStack_88 + -0x10);
        }
        if (lStack_88 == 0) {
          if (field_local._8_8_ == 0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x75,"void wasm::SmallVector<Item, 10>::pop_back() [T = Item, N = 10]");
          }
          field_local._8_8_ = field_local._8_8_ + -1;
        }
        else {
          lStack_88 = lStack_88 + -0x10;
        }
        plVar10 = (long *)(pFVar13->first).id;
        puVar15 = (uintptr_t *)*plVar10;
        puVar3 = (uintptr_t *)plVar10[1];
        if (puVar15 != puVar3) {
          uVar2 = pFVar13->second;
          do {
            type.id = *puVar15;
            __node_gen_1._M_h._0_4_ = uVar6;
            local_68 = local_60;
            __h_1 = (__hashtable *)type.id;
            std::
            _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::pair<wasm::HeapType,unsigned_int>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType,unsigned_int>,true>>>>
                      ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_60,(Item *)&__h_1,&local_68);
            p_Var11 = (__hashtable *)SubTypes::getImmediateSubTypes(&this->subtypes,type);
            if ((((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &p_Var11->_M_buckets)->_M_impl).super__Vector_impl_data._M_start !=
                (pointer)p_Var11->_M_bucket_count) {
              __h_1 = p_Var11;
              __node_gen_1._M_h._0_4_ = uVar2 + 1;
              SmallVector<Item,_10UL>::push_back
                        ((SmallVector<Item,_10UL> *)&field_local.second,(Item *)&__h_1);
            }
            puVar15 = puVar15 + 1;
          } while (puVar15 != puVar3);
        }
      } while ((lStack_88 >> 4) + field_local._8_8_ != 0);
    }
  }
  else {
    auVar16 = ::wasm::HeapType::getDeclaredSuperType();
    field_local._8_8_ = auVar16._0_8_;
    if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      do {
        __h_1 = p_Var11;
        std::
        _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::pair<wasm::HeapType,unsigned_int>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType,unsigned_int>,true>>>>
                  ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)p_Var11,&field_local.second,&__h_1);
        auVar16 = ::wasm::HeapType::getDeclaredSuperType();
        field_local._8_8_ = auVar16._0_8_;
      } while ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
    }
  }
  return;
}

Assistant:

void Inhabitator::markNullable(FieldPos field) {
  // Mark the given field nullable in the original type and in other types
  // necessary to keep subtyping valid.
  nullables.insert(field);
  auto [curr, idx] = field;
  switch (getVariance(field)) {
    case Covariant:
      // Mark the field null in all supertypes. If the supertype field is
      // already nullable or does not exist, that's ok and this will have no
      // effect.
      while (auto super = curr.getDeclaredSuperType()) {
        nullables.insert({*super, idx});
        curr = *super;
      }
      break;
    case Invariant:
      // Find the top type for which this field exists and mark the field
      // nullable in all of its subtypes.
      if (curr.isArray()) {
        while (auto super = curr.getDeclaredSuperType()) {
          curr = *super;
        }
      } else {
        assert(curr.isStruct());
        while (auto super = curr.getDeclaredSuperType()) {
          if (super->getStruct().fields.size() <= idx) {
            break;
          }
          curr = *super;
        }
      }
      // Mark the field nullable in all subtypes. If the subtype field is
      // already nullable, that's ok and this will have no effect. TODO: Remove
      // this extra `index` variable once we have C++20. It's a workaround for
      // lambdas being unable to capture structured bindings.
      const size_t index = idx;
      subtypes.iterSubTypes(curr, [&](HeapType type, Index) {
        nullables.insert({type, index});
      });
      break;
  }
}